

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCopyLogical(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  uint id;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_5c0;
  DiagnosticStream local_3e8;
  DiagnosticStream local_210;
  Instruction *local_38;
  Instruction *source_type;
  Instruction *source;
  Instruction *result_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  result_type = inst;
  inst_local = (Instruction *)_;
  uVar3 = Instruction::type_id(inst);
  source = ValidationState_t::FindDef(_,uVar3);
  pIVar1 = inst_local;
  id = Instruction::GetOperandAs<unsigned_int>(result_type,2);
  source_type = ValidationState_t::FindDef((ValidationState_t *)pIVar1,id);
  pIVar1 = inst_local;
  uVar3 = Instruction::type_id(source_type);
  local_38 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar3);
  if (((local_38 == (Instruction *)0x0) || (source == (Instruction *)0x0)) || (local_38 == source))
  {
    ValidationState_t::diag
              (&local_210,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,result_type);
    pDVar4 = DiagnosticStream::operator<<
                       (&local_210,(char (*) [44])"Result Type must not equal the Operand type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_210);
  }
  else {
    bVar2 = ValidationState_t::LogicallyMatch((ValidationState_t *)inst_local,local_38,source,false)
    ;
    if (bVar2) {
      bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Shader);
      pIVar1 = inst_local;
      if (bVar2) {
        uVar3 = Instruction::type_id(result_type);
        bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                          ((ValidationState_t *)pIVar1,uVar3);
        if (bVar2) {
          ValidationState_t::diag
                    (&local_5c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,result_type);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_5c0,
                              (char (*) [45])"Cannot copy composites of 8- or 16-bit types");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_5c0);
          return __local._4_4_;
        }
      }
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                (&local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,result_type);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_3e8,
                          (char (*) [54])"Result Type does not logically match the Operand type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_3e8);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateCopyLogical(ValidationState_t& _,
                                 const Instruction* inst) {
  const auto result_type = _.FindDef(inst->type_id());
  const auto source = _.FindDef(inst->GetOperandAs<uint32_t>(2u));
  const auto source_type = _.FindDef(source->type_id());
  if (!source_type || !result_type || source_type == result_type) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Result Type must not equal the Operand type";
  }

  if (!_.LogicallyMatch(source_type, result_type, false)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Result Type does not logically match the Operand type";
  }

  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Cannot copy composites of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}